

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void pbrt::rply_message_callback(p_ply ply,char *message)

{
  char **in_stack_00000018;
  char *in_stack_00000020;
  
  Warning<char_const*&>(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void rply_message_callback(p_ply ply, const char *message) {
    Warning("rply: %s", message);
}